

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall
denialofservice_tests::stale_tip_peer_management::test_method(stale_tip_peer_management *this)

{
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  CNode *pCVar1;
  NodeId NVar2;
  seconds mock_time_in;
  Options opts;
  undefined8 uVar3;
  CChainParams *params;
  CConnman *pCVar4;
  time_point tVar5;
  seconds mock_time_in_00;
  int64_t iVar6;
  pointer ppCVar7;
  int i;
  int iVar8;
  pointer ppCVar9;
  long lVar10;
  iterator pvVar11;
  iterator pvVar12;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  vector<CNode_*,_std::allocator<CNode_*>_> vNodes;
  __single_object connman;
  NodeId id;
  check_type cVar13;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  lazy_ostream local_1e0;
  undefined1 *local_1d0;
  char **local_1c8;
  assertion_result local_1c0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<CNode_*,_std::allocator<CNode_*>_> local_188;
  undefined1 local_170 [16];
  NodeId local_160;
  undefined1 local_158 [40];
  seconds sStack_130;
  uint64_t local_128;
  seconds local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_100;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_e8;
  vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> local_d0;
  vector<CService,_std::allocator<CService>_> local_b8;
  vector<CService,_std::allocator<CService>_> local_a0;
  bool local_87;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  undefined1 auStack_68 [48];
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_160 = 0;
  addrman_in = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  params = Params();
  pCVar4 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(pCVar4,0x1337,0x1337,addrman_in,netgroupman,params,true);
  auStack_68._32_2_ = 0;
  auStack_68._36_4_ = 100;
  auStack_68._40_4_ = 100;
  auStack_68._44_2_ = 0;
  _cVar13 = (check_type)((ulong)CONCAT42(100,auStack_68._34_2_) << 0x10);
  opts._8_8_ = (undefined8)_cVar13;
  opts._0_8_ = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  local_170._8_8_ = pCVar4;
  PeerManager::make((CConnman *)local_170,(AddrMan *)pCVar4,
                    (BanMan *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  local_158._0_8_ = (__pthread_internal_list *)0x0;
  local_158._16_8_ = 0;
  local_158._24_8_ = (NetEventsInterface *)0x0;
  local_158._32_8_ = (BanMan *)0x0;
  sStack_130.__r = 0;
  local_128 = 0;
  local_120.__r = 0x3c;
  memset(&local_118,0,0x90);
  local_87 = true;
  auStack_68._25_2_ = 0x100;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (_Elt_pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (_Elt_pointer)0x0;
  local_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_Elt_pointer)0x0;
  auStack_68._0_8_ = (pointer)0x0;
  auStack_68._8_8_ = 0;
  auStack_68._16_8_ = 0;
  local_158._8_4_ = 0x7d;
  tVar5 = NodeClock::now();
  mock_time_in.__r = (long)tVar5.__d.__r / 1000000000;
  SetMockTime(mock_time_in);
  lVar10 = (((((this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
            chainparams)->consensus).nPowTargetSpacing;
  CConnman::Init((CConnman *)local_170._8_8_,(Options *)local_158);
  mock_time_in_00.__r = lVar10 * 3 + mock_time_in.__r + 1;
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar8 = 8;
  do {
    pvVar11 = (iterator)0x1;
    pCVar4 = (CConnman *)local_170._8_8_;
    OutboundTest::AddRandomOutboundPeer
              (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
               (ConnmanTestMsg *)local_170._8_8_,OUTBOUND_FULL_RELAY,false);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  ppCVar7 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar9 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar9 != ppCVar7; ppCVar9 = ppCVar9 + 1) {
    pCVar1 = *ppCVar9;
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xa7;
    file.m_begin = (iterator)&local_198;
    msg.m_end = pvVar11;
    msg.m_begin = (iterator)pCVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(~(pCVar1->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "node->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_1f8 = "";
    pCVar4 = (CConnman *)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_200,0xa7);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  }
  SetMockTime(mock_time_in_00);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xaf;
  file_00.m_begin = (iterator)&local_210;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = (iterator)pCVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_220,
             msg_00);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CConnman::GetTryNewOutboundPeer((CConnman *)local_170._8_8_);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8 = &local_1f0;
  local_1f0 = "connman->GetTryNewOutboundPeer()";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_228 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_230,0xaf);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  ppCVar9 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppCVar7 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pCVar1 = *ppCVar7;
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
      ;
      local_238 = "";
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xb3;
      file_01.m_begin = (iterator)&local_240;
      msg_01.m_end = pvVar12;
      msg_01.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_250,
                 msg_01);
      local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(~(pCVar1->fDisconnect)._M_base._M_i & 1);
      local_1c0.m_message.px = (element_type *)0x0;
      local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1f0 = "node->fDisconnect == false";
      local_1e8 = "";
      local_1e0.m_empty = false;
      local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
      local_1d0 = boost::unit_test::lazy_ostream::inst;
      local_1c8 = &local_1f0;
      local_260 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
      ;
      local_258 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_260,0xb3);
      boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar9);
  }
  SetMockTime(mock_time_in);
  pvVar11 = (iterator)0x1;
  pCVar4 = (CConnman *)local_170._8_8_;
  OutboundTest::AddRandomOutboundPeer
            (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
             (ConnmanTestMsg *)local_170._8_8_,OUTBOUND_FULL_RELAY,false);
  SetMockTime(mock_time_in_00);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar10 = 0;
  do {
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_268 = "";
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xbf;
    file_02.m_begin = (iterator)&local_270;
    msg_02.m_end = pvVar11;
    msg_02.m_begin = (iterator)pCVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_280,
               msg_02);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_288 = "";
    pCVar4 = (CConnman *)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_290,0xbf);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xc2;
  file_03.m_begin = (iterator)&local_2a0;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = (iterator)pCVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b0,
             msg_03);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2b8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_2c0,0xc2);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  uVar3 = local_170._0_8_;
  LOCK();
  (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_finish[-1]->fDisconnect)._M_base._M_i = false;
  UNLOCK();
  NVar2 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->id;
  iVar6 = GetTime();
  (**(code **)(*(long *)uVar3 + 0xb0))(uVar3,NVar2,iVar6);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar10 = 0;
  do {
    local_2d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_2c8 = "";
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xcc;
    file_04.m_begin = (iterator)&local_2d0;
    msg_04.m_end = pvVar12;
    msg_04.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2e0,
               msg_04);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_2f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_2e8 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_2f0,0xcc);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 7);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xce;
  file_05.m_begin = (iterator)&local_300;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_310,
             msg_05);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_start[7]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[max_outbound_full_relay-1]->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_318 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_320,0xce);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xcf;
  file_06.m_begin = (iterator)&local_330;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_340,
             msg_06);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_348 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_350,0xcf);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  LOCK();
  (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_start[7]->fDisconnect)._M_base._M_i = false;
  UNLOCK();
  SetMockTime(mock_time_in);
  pvVar11 = (iterator)0x1;
  pCVar4 = (CConnman *)local_170._8_8_;
  OutboundTest::AddRandomOutboundPeer
            (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
             (ConnmanTestMsg *)local_170._8_8_,OUTBOUND_FULL_RELAY,true);
  SetMockTime(mock_time_in_00);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  lVar10 = 0;
  do {
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xdb;
    file_07.m_begin = (iterator)&local_360;
    msg_07.m_end = pvVar11;
    msg_07.m_begin = (iterator)pCVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_370,
               msg_07);
    local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1c0.m_message.px = (element_type *)0x0;
    local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = "vNodes[i]->fDisconnect == false";
    local_1e8 = "";
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_1f0;
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_378 = "";
    pCVar4 = (CConnman *)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_380,0xdb);
    boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xdd;
  file_08.m_begin = (iterator)&local_390;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = (iterator)pCVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3a0,
             msg_08);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_start[6]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[max_outbound_full_relay - 2]->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3a8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_3b0,0xdd);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xde;
  file_09.m_begin = (iterator)&local_3c0;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3d0,
             msg_09);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_start[7]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[max_outbound_full_relay - 1]->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3d8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_3e0,0xde);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xdf;
  file_10.m_begin = (iterator)&local_3f0;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_400,
             msg_10);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_start[8]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes[max_outbound_full_relay]->fDisconnect == false";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_408 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_410,0xdf);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  SetMockTime(mock_time_in);
  pvVar11 = (iterator)0x1;
  pCVar4 = (CConnman *)local_170._8_8_;
  OutboundTest::AddRandomOutboundPeer
            (&this->super_OutboundTest,&local_160,&local_188,(PeerManager *)local_170._0_8_,
             (ConnmanTestMsg *)local_170._8_8_,OUTBOUND_FULL_RELAY,true);
  SetMockTime(mock_time_in_00);
  (**(code **)(*(long *)local_170._0_8_ + 0xa0))();
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xe7;
  file_11.m_begin = (iterator)&local_420;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = (iterator)pCVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_430,
             msg_11);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "vNodes.back()->fDisconnect == true";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_1f0;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_438 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar13,(size_t)&local_440,0xe7);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  ppCVar9 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar7 = local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar7 != ppCVar9; ppCVar7 = ppCVar7 + 1) {
    (*((NetEventsInterface *)(local_170._0_8_ + 8))->_vptr_NetEventsInterface[1])
              ((NetEventsInterface *)(local_170._0_8_ + 8),*ppCVar7);
  }
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)local_170._8_8_);
  if (local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_a0);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_b8);
  std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>::~vector(&local_d0)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector(&local_e8)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            (&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  if ((PeerManager *)local_170._0_8_ != (PeerManager *)0x0) {
    (**(code **)(*(long *)local_170._0_8_ + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)(local_170 + 8));
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(stale_tip_peer_management, OutboundTest)
{
    NodeId id{0};
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    constexpr int max_outbound_full_relay = MAX_OUTBOUND_FULL_RELAY_CONNECTIONS;
    CConnman::Options options;
    options.m_max_automatic_connections = DEFAULT_MAX_PEER_CONNECTIONS;

    const auto time_init{GetTime<std::chrono::seconds>()};
    SetMockTime(time_init);
    const auto time_later{time_init + 3 * std::chrono::seconds{m_node.chainman->GetConsensus().nPowTargetSpacing} + 1s};
    connman->Init(options);
    std::vector<CNode *> vNodes;

    // Mock some outbound peers
    for (int i = 0; i < max_outbound_full_relay; ++i) {
        AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    }

    peerLogic->CheckForStaleTipAndEvictPeers();

    // No nodes should be marked for disconnection while we have no extra peers
    for (const CNode *node : vNodes) {
        BOOST_CHECK(node->fDisconnect == false);
    }

    SetMockTime(time_later);

    // Now tip should definitely be stale, and we should look for an extra
    // outbound peer
    peerLogic->CheckForStaleTipAndEvictPeers();
    BOOST_CHECK(connman->GetTryNewOutboundPeer());

    // Still no peers should be marked for disconnection
    for (const CNode *node : vNodes) {
        BOOST_CHECK(node->fDisconnect == false);
    }

    // If we add one more peer, something should get marked for eviction
    // on the next check (since we're mocking the time to be in the future, the
    // required time connected check should be satisfied).
    SetMockTime(time_init);
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    SetMockTime(time_later);

    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_full_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    // Last added node should get marked for eviction
    BOOST_CHECK(vNodes.back()->fDisconnect == true);

    vNodes.back()->fDisconnect = false;

    // Update the last announced block time for the last
    // peer, and check that the next newest node gets evicted.
    peerLogic->UpdateLastBlockAnnounceTime(vNodes.back()->GetId(), GetTime());

    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_full_relay - 1; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes[max_outbound_full_relay-1]->fDisconnect == true);
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    vNodes[max_outbound_full_relay - 1]->fDisconnect = false;

    // Add an onion peer, that will be protected because it is the only one for
    // its network, so another peer gets disconnected instead.
    SetMockTime(time_init);
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::OUTBOUND_FULL_RELAY, /*onion_peer=*/true);
    SetMockTime(time_later);
    peerLogic->CheckForStaleTipAndEvictPeers();

    for (int i = 0; i < max_outbound_full_relay - 2; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes[max_outbound_full_relay - 2]->fDisconnect == false);
    BOOST_CHECK(vNodes[max_outbound_full_relay - 1]->fDisconnect == true);
    BOOST_CHECK(vNodes[max_outbound_full_relay]->fDisconnect == false);

    // Add a second onion peer which won't be protected
    SetMockTime(time_init);
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::OUTBOUND_FULL_RELAY, /*onion_peer=*/true);
    SetMockTime(time_later);
    peerLogic->CheckForStaleTipAndEvictPeers();

    BOOST_CHECK(vNodes.back()->fDisconnect == true);

    for (const CNode *node : vNodes) {
        peerLogic->FinalizeNode(*node);
    }

    connman->ClearTestNodes();
}